

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reshape.cpp
# Opt level: O3

void CoreMLConverter::convertCaffeReshape(ConvertLayerParameters layerParameters)

{
  RepeatedField<long> *this;
  Rep *pRVar1;
  string *psVar2;
  string *psVar3;
  Arena *pAVar4;
  WeightParams *pWVar5;
  void *pvVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  Type *pTVar11;
  Type *pTVar12;
  BlobShape *pBVar13;
  BlobShape *pBVar14;
  LogMessage *pLVar15;
  LayerUnion this_00;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  long lVar20;
  long lVar21;
  int iVar22;
  uint uVar23;
  ReshapeParameter *pRVar24;
  ulong __val;
  void **ppvVar25;
  string __str;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_00000028;
  int *in_stack_00000048;
  string __str_3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  string local_108;
  undefined1 local_e8 [63];
  LogFinisher local_a9;
  Type *local_a8;
  ReshapeParameter *local_a0;
  string local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  Type *local_38;
  
  pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                      ((RepeatedPtrFieldBase *)(__str._M_string_length + 0x70),*in_stack_00000048);
  pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)__str.field_2._8_8_,(Type *)0x0);
  if (((pTVar11->bottom_).super_RepeatedPtrFieldBase.current_size_ != 1) ||
     (iVar10 = 1, (pTVar11->top_).super_RepeatedPtrFieldBase.current_size_ != 1)) {
    local_e8._0_8_ = local_e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_e8,"Must have 1 input and 1 output","");
    errorInCaffeProto((string *)local_e8,(pTVar11->name_).ptr_,(pTVar11->type_).ptr_);
    if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
      operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
    }
    iVar10 = (pTVar11->bottom_).super_RepeatedPtrFieldBase.current_size_;
  }
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pRVar1 = (pTVar11->bottom_).super_RepeatedPtrFieldBase.rep_;
  ppvVar25 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar25 = (void **)0x0;
  }
  local_a8 = pTVar11;
  local_38 = pTVar12;
  if (iVar10 != 0) {
    lVar20 = 0;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_58,*(value_type **)((long)ppvVar25 + lVar20));
      lVar20 = lVar20 + 8;
    } while ((long)iVar10 * 8 != lVar20);
  }
  pRVar1 = (local_a8->top_).super_RepeatedPtrFieldBase.rep_;
  ppvVar25 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar25 = (void **)0x0;
  }
  lVar20 = (long)(local_a8->top_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar20 != 0) {
    lVar21 = 0;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_78,*(value_type **)((long)ppvVar25 + lVar21));
      lVar21 = lVar21 + 8;
    } while (lVar20 * 8 != lVar21);
  }
  pTVar11 = local_a8;
  convertCaffeMetadata
            ((local_a8->name_).ptr_,&local_58,&local_78,
             (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)__str.field_2._8_8_,
             in_stack_00000028);
  pRVar24 = pTVar11->reshape_param_;
  if (pRVar24 == (ReshapeParameter *)0x0) {
    pRVar24 = (ReshapeParameter *)&caffe::_ReshapeParameter_default_instance_;
  }
  local_a0 = pRVar24;
  if (pRVar24->axis_ != 0) {
    local_e8._0_8_ = local_e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"axis","");
    uVar19 = pRVar24->axis_;
    uVar8 = -uVar19;
    if (0 < (int)uVar19) {
      uVar8 = uVar19;
    }
    uVar23 = 1;
    if (9 < uVar8) {
      uVar18 = (ulong)uVar8;
      uVar9 = 4;
      do {
        uVar23 = uVar9;
        uVar16 = (uint)uVar18;
        if (uVar16 < 100) {
          uVar23 = uVar23 - 2;
          goto LAB_003ec424;
        }
        if (uVar16 < 1000) {
          uVar23 = uVar23 - 1;
          goto LAB_003ec424;
        }
        if (uVar16 < 10000) goto LAB_003ec424;
        uVar18 = uVar18 / 10000;
        uVar9 = uVar23 + 4;
      } while (99999 < uVar16);
      uVar23 = uVar23 + 1;
    }
LAB_003ec424:
    psVar2 = (pTVar11->name_).ptr_;
    psVar3 = (pTVar11->type_).ptr_;
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_108,(char)uVar23 - (char)((int)uVar19 >> 0x1f))
    ;
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_108._M_dataplus._M_p + (uVar19 >> 0x1f),uVar23,uVar8);
    unsupportedCaffeParrameterWithOption((string *)local_e8,psVar2,psVar3,&local_108);
    pRVar24 = local_a0;
    pTVar11 = local_a8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
      operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
    }
  }
  if (pRVar24->num_axes_ != -1) {
    local_e8._0_8_ = local_e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"num_axes","");
    uVar19 = pRVar24->num_axes_;
    uVar8 = -uVar19;
    if (0 < (int)uVar19) {
      uVar8 = uVar19;
    }
    uVar23 = 1;
    if (9 < uVar8) {
      uVar18 = (ulong)uVar8;
      uVar9 = 4;
      do {
        uVar23 = uVar9;
        uVar16 = (uint)uVar18;
        if (uVar16 < 100) {
          uVar23 = uVar23 - 2;
          goto LAB_003ec546;
        }
        if (uVar16 < 1000) {
          uVar23 = uVar23 - 1;
          goto LAB_003ec546;
        }
        if (uVar16 < 10000) goto LAB_003ec546;
        uVar18 = uVar18 / 10000;
        uVar9 = uVar23 + 4;
      } while (99999 < uVar16);
      uVar23 = uVar23 + 1;
    }
LAB_003ec546:
    psVar2 = (pTVar11->name_).ptr_;
    psVar3 = (pTVar11->type_).ptr_;
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_108,(char)uVar23 - (char)((int)uVar19 >> 0x1f))
    ;
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_108._M_dataplus._M_p + (uVar19 >> 0x1f),uVar23,uVar8);
    unsupportedCaffeParrameterWithOption((string *)local_e8,psVar2,psVar3,&local_108);
    pRVar24 = local_a0;
    pTVar11 = local_a8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
      operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
    }
  }
  pBVar14 = pRVar24->shape_;
  pBVar13 = pBVar14;
  if (pBVar14 == (BlobShape *)0x0) {
    pBVar13 = (BlobShape *)&caffe::_BlobShape_default_instance_;
  }
  if ((pBVar13->dim_).current_size_ != 4) {
    local_e8._0_8_ = local_e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"shape size","");
    pBVar14 = pRVar24->shape_;
    if (pBVar14 == (BlobShape *)0x0) {
      pBVar14 = (BlobShape *)&caffe::_BlobShape_default_instance_;
    }
    uVar19 = (pBVar14->dim_).current_size_;
    uVar8 = -uVar19;
    if (0 < (int)uVar19) {
      uVar8 = uVar19;
    }
    uVar23 = 1;
    if (9 < uVar8) {
      uVar18 = (ulong)uVar8;
      uVar9 = 4;
      do {
        uVar23 = uVar9;
        uVar16 = (uint)uVar18;
        if (uVar16 < 100) {
          uVar23 = uVar23 - 2;
          goto LAB_003ec68a;
        }
        if (uVar16 < 1000) {
          uVar23 = uVar23 - 1;
          goto LAB_003ec68a;
        }
        if (uVar16 < 10000) goto LAB_003ec68a;
        uVar18 = uVar18 / 10000;
        uVar9 = uVar23 + 4;
      } while (99999 < uVar16);
      uVar23 = uVar23 + 1;
    }
LAB_003ec68a:
    psVar2 = (pTVar11->name_).ptr_;
    psVar3 = (pTVar11->type_).ptr_;
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_108,(char)uVar23 - (char)((int)uVar19 >> 0x1f))
    ;
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_108._M_dataplus._M_p + (uVar19 >> 0x1f),uVar23,uVar8);
    unsupportedCaffeParrameterWithOption((string *)local_e8,psVar2,psVar3,&local_108);
    pRVar24 = local_a0;
    pTVar11 = local_a8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
      operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
    }
    pBVar14 = pRVar24->shape_;
  }
  if (pBVar14 == (BlobShape *)0x0) {
    pBVar14 = (BlobShape *)&caffe::_BlobShape_default_instance_;
  }
  if ((pBVar14->dim_).current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_e8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x476);
    pLVar15 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_e8,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_108,pLVar15);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_e8);
  }
  if (((pBVar14->dim_).rep_)->elements[0] != 0) {
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"shape dims[0]","");
    pBVar14 = pRVar24->shape_;
    if (pBVar14 == (BlobShape *)0x0) {
      pBVar14 = (BlobShape *)&caffe::_BlobShape_default_instance_;
    }
    psVar2 = (pTVar11->name_).ptr_;
    psVar3 = (pTVar11->type_).ptr_;
    if ((pBVar14->dim_).current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_e8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x476);
      pLVar15 = google::protobuf::internal::LogMessage::operator<<
                          ((LogMessage *)local_e8,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=(&local_a9,pLVar15);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_e8);
    }
    uVar18 = ((pBVar14->dim_).rep_)->elements[0];
    __val = -uVar18;
    if (0 < (long)uVar18) {
      __val = uVar18;
    }
    uVar19 = 1;
    if (9 < __val) {
      uVar17 = __val;
      uVar8 = 4;
      do {
        uVar19 = uVar8;
        if (uVar17 < 100) {
          uVar19 = uVar19 - 2;
          goto LAB_003ec877;
        }
        if (uVar17 < 1000) {
          uVar19 = uVar19 - 1;
          goto LAB_003ec877;
        }
        if (uVar17 < 10000) goto LAB_003ec877;
        bVar7 = 99999 < uVar17;
        uVar17 = uVar17 / 10000;
        uVar8 = uVar19 + 4;
      } while (bVar7);
      uVar19 = uVar19 + 1;
    }
LAB_003ec877:
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_98,(char)uVar19 - (char)((long)uVar18 >> 0x3f))
    ;
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_98._M_dataplus._M_p + -((long)uVar18 >> 0x3f),uVar19,__val);
    unsupportedCaffeParrameterWithOption(&local_108,psVar2,psVar3,&local_98);
    pRVar24 = local_a0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    pTVar11 = local_a8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
  }
  pBVar14 = pRVar24->shape_;
  if (pBVar14 == (BlobShape *)0x0) {
    pBVar14 = (BlobShape *)&caffe::_BlobShape_default_instance_;
  }
  if ((pBVar14->dim_).current_size_ < 2) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_e8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x476);
    pLVar15 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_e8,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_108,pLVar15);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_e8);
  }
  if (0 < (long)(pBVar14->dim_).rep_[1].arena) {
    pBVar14 = pRVar24->shape_;
    if (pBVar14 == (BlobShape *)0x0) {
      pBVar14 = (BlobShape *)&caffe::_BlobShape_default_instance_;
    }
    if ((pBVar14->dim_).current_size_ < 3) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_e8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x476);
      pLVar15 = google::protobuf::internal::LogMessage::operator<<
                          ((LogMessage *)local_e8,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_108,pLVar15);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_e8);
    }
    if (0 < (pBVar14->dim_).rep_[1].elements[0]) {
      pBVar14 = pRVar24->shape_;
      if (pBVar14 == (BlobShape *)0x0) {
        pBVar14 = (BlobShape *)&caffe::_BlobShape_default_instance_;
      }
      if ((pBVar14->dim_).current_size_ < 4) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_e8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x476);
        pLVar15 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_e8,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_108,pLVar15);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_e8);
      }
      if (0 < (long)(pBVar14->dim_).rep_[2].arena) goto LAB_003eca83;
    }
  }
  local_e8._0_8_ = local_e8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e8,"shape dims[0], dims[1], dims[2] must all be positve","");
  unsupportedCaffeParrameter((string *)local_e8,(pTVar11->name_).ptr_,(pTVar11->type_).ptr_);
  if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
    operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
  }
LAB_003eca83:
  pTVar12 = local_38;
  if (local_38->_oneof_case_[0] == 300) {
    this_00 = local_38->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(local_38);
    pTVar12->_oneof_case_[0] = 300;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x30);
    CoreML::Specification::ReshapeLayerParams::ReshapeLayerParams(this_00.reshape_);
    (pTVar12->layer_).reshape_ = (ReshapeLayerParams *)this_00;
  }
  pBVar14 = pRVar24->shape_;
  if (pBVar14 == (BlobShape *)0x0) {
    pBVar14 = (BlobShape *)&caffe::_BlobShape_default_instance_;
  }
  if ((pBVar14->dim_).current_size_ < 2) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_e8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x476);
    pLVar15 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_e8,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_108,pLVar15);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_e8);
  }
  pAVar4 = (pBVar14->dim_).rep_[1].arena;
  this = &(this_00.reshape_)->targetshape_;
  iVar10 = ((this_00.convolution_)->kernelsize_).current_size_;
  if (iVar10 == ((this_00.convolution_)->kernelsize_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(this,iVar10 + 1);
    iVar10 = this->current_size_;
  }
  pWVar5 = (this_00.innerproduct_)->bias_;
  iVar22 = iVar10 + 1;
  ((this_00.convolution_)->kernelsize_).current_size_ = iVar22;
  (&pWVar5->_internal_metadata_)[iVar10].
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = pAVar4;
  pBVar14 = pRVar24->shape_;
  if (pBVar14 == (BlobShape *)0x0) {
    pBVar14 = (BlobShape *)&caffe::_BlobShape_default_instance_;
  }
  if ((pBVar14->dim_).current_size_ < 3) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_e8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x476);
    pLVar15 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_e8,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_108,pLVar15);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_e8);
    iVar22 = this->current_size_;
  }
  pvVar6 = (void *)(pBVar14->dim_).rep_[1].elements[0];
  if (iVar22 == ((this_00.convolution_)->kernelsize_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(this,iVar22 + 1);
    iVar22 = this->current_size_;
  }
  pWVar5 = (this_00.innerproduct_)->bias_;
  iVar10 = iVar22 + 1;
  ((this_00.convolution_)->kernelsize_).current_size_ = iVar10;
  (&pWVar5->_internal_metadata_)[iVar22].
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = pvVar6;
  pBVar14 = pRVar24->shape_;
  if (pBVar14 == (BlobShape *)0x0) {
    pBVar14 = (BlobShape *)&caffe::_BlobShape_default_instance_;
  }
  if ((pBVar14->dim_).current_size_ < 4) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_e8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x476);
    pLVar15 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_e8,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_108,pLVar15);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_e8);
    iVar10 = this->current_size_;
  }
  pAVar4 = (pBVar14->dim_).rep_[2].arena;
  if (iVar10 == ((this_00.convolution_)->kernelsize_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(this,iVar10 + 1);
    iVar10 = this->current_size_;
  }
  pWVar5 = (this_00.innerproduct_)->bias_;
  ((this_00.convolution_)->kernelsize_).current_size_ = iVar10 + 1;
  (&pWVar5->_internal_metadata_)[iVar10].
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = pAVar4;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  return;
}

Assistant:

void CoreMLConverter::convertCaffeReshape(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
    
    //Write Layer metadata
    auto* nnWrite = layerParameters.nnWrite;
    Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
    if (caffeLayer.bottom_size() != 1 || caffeLayer.top_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 input and 1 output",caffeLayer.name(),caffeLayer.type());
    }
    std::vector<std::string> bottom;
    std::vector<std::string> top;
    for (const auto& bottomName: caffeLayer.bottom()){
        bottom.push_back(bottomName);
    }
    for (const auto& topName: caffeLayer.top()){
        top.push_back(topName);
    }
    CoreMLConverter::convertCaffeMetadata(caffeLayer.name(), 
                                         bottom, top,
                                         nnWrite, mappingDataBlobNames);
    
    const caffe::ReshapeParameter& caffeLayerParams = caffeLayer.reshape_param();
    
    
    //***************** Some Error Checking in Caffe Proto **********
    if (caffeLayerParams.axis() != 0){
        CoreMLConverter::unsupportedCaffeParrameterWithOption("axis",caffeLayer.name(),caffeLayer.type(),std::to_string(caffeLayerParams.axis()));
    }
    if (caffeLayerParams.num_axes() != -1){
        CoreMLConverter::unsupportedCaffeParrameterWithOption("num_axes",caffeLayer.name(),caffeLayer.type(),std::to_string(caffeLayerParams.num_axes()));
    }
    if (caffeLayerParams.shape().dim_size() != 4){
        CoreMLConverter::unsupportedCaffeParrameterWithOption("shape size",caffeLayer.name(),caffeLayer.type(),std::to_string(caffeLayerParams.shape().dim_size()));
    }
    if (caffeLayerParams.shape().dim(0) != 0){
        CoreMLConverter::unsupportedCaffeParrameterWithOption("shape dims[0]",caffeLayer.name(),caffeLayer.type(),std::to_string(caffeLayerParams.shape().dim(0)));
    }
    if (!(caffeLayerParams.shape().dim(1) > 0 && caffeLayerParams.shape().dim(2) > 0 && caffeLayerParams.shape().dim(3) > 0)){
        CoreMLConverter::unsupportedCaffeParrameter("shape dims[0], dims[1], dims[2] must all be positve",caffeLayer.name(),caffeLayer.type());
    }
    //***************************************************************
    
    Specification::ReshapeLayerParams* specLayerParams = specLayer->mutable_reshape();
    specLayerParams->add_targetshape(caffeLayerParams.shape().dim(1)); //C
    specLayerParams->add_targetshape(caffeLayerParams.shape().dim(2)); //H
    specLayerParams->add_targetshape(caffeLayerParams.shape().dim(3)); //W
    
}